

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.h
# Opt level: O2

void __thiscall
Minisat::Solver::shareViaCallback<Minisat::vec<Minisat::Lit>>
          (Solver *this,vec<Minisat::Lit> *v,int lbd)

{
  vector<int,_std::allocator<int>_> *this_00;
  int iVar1;
  uint uVar2;
  Lit *pLVar3;
  int *piVar4;
  pointer piVar5;
  bool bVar6;
  int i;
  long lVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  
  if (lbd <= this->core_lbd_cut) {
    iVar1 = v->sz;
    if (iVar1 <= this->share_clause_max_size) {
      bVar10 = this->learnCallback == (_func_void_void_ptr_int_ptr *)0x0;
      bVar6 = this->learnCallbackLimit < iVar1;
      if (!bVar6 && !bVar10) {
        std::vector<int,_std::allocator<int>_>::resize(&this->learnCallbackBuffer,(long)iVar1 + 1);
        pLVar3 = v->data;
        piVar4 = (this->learnCallbackBuffer).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        for (lVar7 = 0; lVar7 < v->sz; lVar7 = lVar7 + 1) {
          uVar2 = pLVar3[lVar7].x;
          uVar8 = (int)uVar2 >> 1;
          uVar9 = ~uVar8;
          if ((uVar2 & 1) == 0) {
            uVar9 = uVar8 + 1;
          }
          piVar4[lVar7] = uVar9;
        }
        piVar4[v->sz] = 0;
        (*this->learnCallback)(this->learnCallbackState,piVar4);
      }
      if (((this->share_parallel == true) &&
          (this->learnedClsCallback !=
           (_func_void_vector<int,_std::allocator<int>_>_ptr_int_void_ptr *)0x0)) &&
         (((long)v->sz < 3 || (lbd <= this->core_lbd_cut)))) {
        this_00 = &this->learnCallbackBuffer;
        std::vector<int,_std::allocator<int>_>::resize(this_00,(long)v->sz);
        if (bVar6 || bVar10) {
          pLVar3 = v->data;
          piVar5 = (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          for (lVar7 = 0; lVar7 < v->sz; lVar7 = lVar7 + 1) {
            uVar2 = pLVar3[lVar7].x;
            uVar8 = (int)uVar2 >> 1;
            uVar9 = ~uVar8;
            if ((uVar2 & 1) == 0) {
              uVar9 = uVar8 + 1;
            }
            piVar5[lVar7] = uVar9;
          }
        }
        (*this->learnedClsCallback)(this_00,lbd,this->issuer);
        return;
      }
    }
  }
  return;
}

Assistant:

inline void Solver::shareViaCallback(const V &v, int lbd)
{
    if (lbd > core_lbd_cut) return;
    if (v.size() > share_clause_max_size) return;

    bool filled_buffer = false;

    if (learnCallback != 0 && v.size() <= learnCallbackLimit) {
        learnCallbackBuffer.resize(v.size() + 1);
        for (int i = 0; i < v.size(); i++) {
            Lit lit = v[i];
            learnCallbackBuffer[i] = sign(lit) ? -(var(lit) + 1) : (var(lit) + 1);
        }
        learnCallbackBuffer[v.size()] = 0;
        filled_buffer = true;
        learnCallback(learnCallbackState, &(learnCallbackBuffer[0]));
    }

    /* share only limited clauses in parallel solving! */
    if (share_parallel && learnedClsCallback != 0 && (v.size() < 3 || lbd <= core_lbd_cut)) {
        learnCallbackBuffer.resize(v.size());
        if (!filled_buffer) {
            for (int i = 0; i < v.size(); i++) {
                Lit lit = v[i];
                learnCallbackBuffer[i] = sign(lit) ? -(var(lit) + 1) : (var(lit) + 1);
            }
        }
        learnedClsCallback(learnCallbackBuffer, lbd, issuer);
    }
}